

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinFdBeginPatchC::emulate_mthd(MthdKelvinFdBeginPatchC *this)

{
  MthdKelvinFdBeginPatchC *this_local;
  
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type == 0x20) {
    if (((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d <<
               0x3c) < 0) &&
       (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                           debug_fd_check_skip << 0x3d))) {
      if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc <<
                0x3b) < 0) {
        nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x80000)
        ;
      }
      if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc <<
                0x38) < 0) {
        nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x80000)
        ;
      }
      if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc <<
                0x27) < 0) {
        nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x80000)
        ;
      }
    }
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc & 0xfeffffff;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc & 0xffffff7f |
           0x80;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_shadow_begin_patch_c =
           (this->super_SingleMthdTest).super_MthdTest.val & 0x7fffffff;
      pgraph_fd_cmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x2810,
                    (this->super_SingleMthdTest).super_MthdTest.val);
    }
    else {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.fe3d_misc & 0xfeffffff |
           0x1000000;
    }
  }
  else {
    nv04_pgraph_missing_hw(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type != 0x20) {
			nv04_pgraph_missing_hw(&exp);
			return;
		}
		if (extr(exp.debug_d, 3, 1) && !extr(exp.debug_fd_check_skip, 2, 1)) {
			if (extr(exp.fe3d_misc, 4, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (extr(exp.fe3d_misc, 7, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
			if (extr(exp.fe3d_misc, 24, 1))
				nv04_pgraph_blowup(&exp, 0x80000);
		}
		if (!exp.nsource) {
			insrt(exp.fe3d_misc, 24, 1, 0);
			insrt(exp.fe3d_misc, 7, 1, 1);
			exp.fe3d_shadow_begin_patch_c = val & 0x7fffffff;
			pgraph_fd_cmd(&exp, 0x2810, val);
		} else {
			insrt(exp.fe3d_misc, 24, 1, 1);
		}
	}